

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::protobuf_google_2fprotobuf_2fdescriptor_2eproto::TableStruct::Shutdown(void)

{
  internal::ExplicitlyConstructed<google::protobuf::FileDescriptorSet>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::FileDescriptorSet> *)
             _FileDescriptorSet_default_instance_);
  if (DAT_006fed48 != (long *)0x0) {
    (**(code **)(*DAT_006fed48 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::FileDescriptorProto>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::FileDescriptorProto> *)
             _FileDescriptorProto_default_instance_);
  if (DAT_006fed58 != (long *)0x0) {
    (**(code **)(*DAT_006fed58 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::DescriptorProto_ExtensionRange>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::DescriptorProto_ExtensionRange> *)
             _DescriptorProto_ExtensionRange_default_instance_);
  if (DAT_006fed68 != (long *)0x0) {
    (**(code **)(*DAT_006fed68 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::DescriptorProto_ReservedRange>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::DescriptorProto_ReservedRange> *)
             _DescriptorProto_ReservedRange_default_instance_);
  if (DAT_006fed78 != (long *)0x0) {
    (**(code **)(*DAT_006fed78 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::DescriptorProto>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::DescriptorProto> *)
             _DescriptorProto_default_instance_);
  if (DAT_006fed88 != (long *)0x0) {
    (**(code **)(*DAT_006fed88 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::FieldDescriptorProto>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::FieldDescriptorProto> *)
             _FieldDescriptorProto_default_instance_);
  if (DAT_006fed98 != (long *)0x0) {
    (**(code **)(*DAT_006fed98 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::OneofDescriptorProto>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::OneofDescriptorProto> *)
             _OneofDescriptorProto_default_instance_);
  if (DAT_006feda8 != (long *)0x0) {
    (**(code **)(*DAT_006feda8 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::EnumDescriptorProto>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::EnumDescriptorProto> *)
             _EnumDescriptorProto_default_instance_);
  if (DAT_006fedb8 != (long *)0x0) {
    (**(code **)(*DAT_006fedb8 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::EnumValueDescriptorProto>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::EnumValueDescriptorProto> *)
             _EnumValueDescriptorProto_default_instance_);
  if (DAT_006fedc8 != (long *)0x0) {
    (**(code **)(*DAT_006fedc8 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::ServiceDescriptorProto>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::ServiceDescriptorProto> *)
             _ServiceDescriptorProto_default_instance_);
  if (DAT_006fedd8 != (long *)0x0) {
    (**(code **)(*DAT_006fedd8 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::MethodDescriptorProto>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::MethodDescriptorProto> *)
             _MethodDescriptorProto_default_instance_);
  if (DAT_006fede8 != (long *)0x0) {
    (**(code **)(*DAT_006fede8 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::FileOptions>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::FileOptions> *)_FileOptions_default_instance_)
  ;
  if (DAT_006fedf8 != (long *)0x0) {
    (**(code **)(*DAT_006fedf8 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::MessageOptions>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::MessageOptions> *)
             _MessageOptions_default_instance_);
  if (DAT_006fee08 != (long *)0x0) {
    (**(code **)(*DAT_006fee08 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::FieldOptions>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::FieldOptions> *)
             _FieldOptions_default_instance_);
  if (DAT_006fee18 != (long *)0x0) {
    (**(code **)(*DAT_006fee18 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::OneofOptions>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::OneofOptions> *)
             _OneofOptions_default_instance_);
  if (DAT_006fee28 != (long *)0x0) {
    (**(code **)(*DAT_006fee28 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::EnumOptions>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::EnumOptions> *)_EnumOptions_default_instance_)
  ;
  if (DAT_006fee38 != (long *)0x0) {
    (**(code **)(*DAT_006fee38 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::EnumValueOptions>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::EnumValueOptions> *)
             _EnumValueOptions_default_instance_);
  if (DAT_006fee48 != (long *)0x0) {
    (**(code **)(*DAT_006fee48 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::ServiceOptions>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::ServiceOptions> *)
             _ServiceOptions_default_instance_);
  if (DAT_006fee58 != (long *)0x0) {
    (**(code **)(*DAT_006fee58 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::MethodOptions>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::MethodOptions> *)
             _MethodOptions_default_instance_);
  if (DAT_006fee68 != (long *)0x0) {
    (**(code **)(*DAT_006fee68 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::UninterpretedOption_NamePart>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::UninterpretedOption_NamePart> *)
             _UninterpretedOption_NamePart_default_instance_);
  if (DAT_006fee78 != (long *)0x0) {
    (**(code **)(*DAT_006fee78 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::UninterpretedOption>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::UninterpretedOption> *)
             _UninterpretedOption_default_instance_);
  if (DAT_006fee88 != (long *)0x0) {
    (**(code **)(*DAT_006fee88 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::SourceCodeInfo_Location>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::SourceCodeInfo_Location> *)
             _SourceCodeInfo_Location_default_instance_);
  if (DAT_006fee98 != (long *)0x0) {
    (**(code **)(*DAT_006fee98 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::SourceCodeInfo>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::SourceCodeInfo> *)
             _SourceCodeInfo_default_instance_);
  if (DAT_006feea8 != (long *)0x0) {
    (**(code **)(*DAT_006feea8 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::GeneratedCodeInfo_Annotation>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::GeneratedCodeInfo_Annotation> *)
             _GeneratedCodeInfo_Annotation_default_instance_);
  if (DAT_006feeb8 != (long *)0x0) {
    (**(code **)(*DAT_006feeb8 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::GeneratedCodeInfo>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::GeneratedCodeInfo> *)
             _GeneratedCodeInfo_default_instance_);
  if (DAT_006feec8 != (long *)0x0) {
    (**(code **)(*DAT_006feec8 + 8))();
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _FileDescriptorSet_default_instance_.Shutdown();
  delete file_level_metadata[0].reflection;
  _FileDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[1].reflection;
  _DescriptorProto_ExtensionRange_default_instance_.Shutdown();
  delete file_level_metadata[2].reflection;
  _DescriptorProto_ReservedRange_default_instance_.Shutdown();
  delete file_level_metadata[3].reflection;
  _DescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[4].reflection;
  _FieldDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[5].reflection;
  _OneofDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[6].reflection;
  _EnumDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[7].reflection;
  _EnumValueDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[8].reflection;
  _ServiceDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[9].reflection;
  _MethodDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[10].reflection;
  _FileOptions_default_instance_.Shutdown();
  delete file_level_metadata[11].reflection;
  _MessageOptions_default_instance_.Shutdown();
  delete file_level_metadata[12].reflection;
  _FieldOptions_default_instance_.Shutdown();
  delete file_level_metadata[13].reflection;
  _OneofOptions_default_instance_.Shutdown();
  delete file_level_metadata[14].reflection;
  _EnumOptions_default_instance_.Shutdown();
  delete file_level_metadata[15].reflection;
  _EnumValueOptions_default_instance_.Shutdown();
  delete file_level_metadata[16].reflection;
  _ServiceOptions_default_instance_.Shutdown();
  delete file_level_metadata[17].reflection;
  _MethodOptions_default_instance_.Shutdown();
  delete file_level_metadata[18].reflection;
  _UninterpretedOption_NamePart_default_instance_.Shutdown();
  delete file_level_metadata[19].reflection;
  _UninterpretedOption_default_instance_.Shutdown();
  delete file_level_metadata[20].reflection;
  _SourceCodeInfo_Location_default_instance_.Shutdown();
  delete file_level_metadata[21].reflection;
  _SourceCodeInfo_default_instance_.Shutdown();
  delete file_level_metadata[22].reflection;
  _GeneratedCodeInfo_Annotation_default_instance_.Shutdown();
  delete file_level_metadata[23].reflection;
  _GeneratedCodeInfo_default_instance_.Shutdown();
  delete file_level_metadata[24].reflection;
}